

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

QSize __thiscall QtMWidgets::BlurEffect::minimumSizeHint(BlurEffect *this)

{
  int iVar1;
  int iVar2;
  QSize QVar3;
  
  if (minimumSizeHint()::size == '\0') {
    iVar1 = __cxa_guard_acquire(&minimumSizeHint()::size);
    if (iVar1 != 0) {
      iVar1 = FingerGeometry::width();
      iVar2 = FingerGeometry::height();
      minimumSizeHint::size.wd = iVar1 / 2;
      minimumSizeHint::size.ht = iVar2 / 2;
      __cxa_guard_release(&minimumSizeHint()::size);
    }
  }
  if (this->orientation == Horizontal) {
    QVar3.ht = minimumSizeHint::size.ht;
    QVar3.wd = minimumSizeHint::size.wd;
  }
  else {
    QVar3.ht = minimumSizeHint::size.wd;
    QVar3.wd = minimumSizeHint::size.ht;
  }
  return QVar3;
}

Assistant:

QSize
BlurEffect::minimumSizeHint() const
{
	static const QSize size( FingerGeometry::width() / 2,
		FingerGeometry::height() / 2 );

	return ( orientation == Qt::Horizontal ? size : size.transposed() );
}